

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O0

Args * Args::parse(Args *__return_storage_ptr__,int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int *piVar3;
  allocator local_c01;
  string local_c00;
  allocator local_bd9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  allocator local_bb1;
  string local_bb0;
  allocator local_b89;
  string local_b88;
  undefined1 local_b68 [8];
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inputArg;
  string local_a50;
  allocator local_a29;
  string local_a28;
  allocator local_a01;
  string local_a00;
  undefined1 local_9e0 [8];
  SwitchArg mipsKernelToUserArg;
  string local_930;
  allocator local_909;
  string local_908;
  allocator local_8e1;
  string local_8e0;
  undefined1 local_8c0 [8];
  SwitchArg mipsUserToKernelArg;
  string local_810;
  allocator local_7e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  undefined1 local_750 [8];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  printSymbolValueArg;
  string local_638;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  undefined1 local_5c8 [8];
  SwitchArg printLowestVaddrArg;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  undefined1 local_4a8 [8];
  SwitchArg printEntryArg;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  undefined1 local_388 [8];
  SwitchArg printHighestVaddrArg;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  undefined1 local_240 [8];
  ValueArg<int> roundToPageArg;
  string local_160;
  allocator local_129;
  string local_128;
  undefined1 local_108 [8];
  CmdLine cmdLine;
  char **argv_local;
  int argc_local;
  Args *args;
  
  cmdLine._223_1_ = 0;
  Args(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"object info printer",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"0.1",(allocator *)((long)&roundToPageArg._constraint + 7));
  TCLAP::CmdLine::CmdLine((CmdLine *)local_108,&local_128,' ',&local_160,true);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&roundToPageArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"r",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"round-to-page",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"Round output up",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2d8,"bytes",(allocator *)&printHighestVaddrArg.super_Arg.field_0xa7);
  TCLAP::ValueArg<int>::ValueArg
            ((ValueArg<int> *)local_240,&local_260,&local_288,&local_2b0,false,0,&local_2d8,
             (CmdLineInterface *)local_108,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&printHighestVaddrArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,">",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"highest-vaddr",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f8,"Display highest vaddr",
             (allocator *)&printEntryArg.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_388,&local_3a8,&local_3d0,&local_3f8,(CmdLineInterface *)local_108,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&printEntryArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"E",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,"entrypoint",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_518,"Display entrypoint",
             (allocator *)&printLowestVaddrArg.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_4a8,&local_4c8,&local_4f0,&local_518,(CmdLineInterface *)local_108,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&printLowestVaddrArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"<",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_610,"lowest-vaddr",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_638,"Display lowest vaddr",
             (allocator *)((long)&printSymbolValueArg._constraint + 7));
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_5c8,&local_5e8,&local_610,&local_638,(CmdLineInterface *)local_108,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator((allocator<char> *)((long)&printSymbolValueArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,"S",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"symbol-value",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,"Display symbol value",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_810,"sym",(allocator *)&mipsUserToKernelArg.super_Arg.field_0xa7);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_750,&local_770,&local_798,&local_7c0,false,&local_7e8,&local_810,
             (CmdLineInterface *)local_108,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&mipsUserToKernelArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e0,"1",&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_908,"to-kseg0",&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_930,"Convert MIPS VMAs to kseg1",
             (allocator *)&mipsKernelToUserArg.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_8c0,&local_8e0,&local_908,&local_930,(CmdLineInterface *)local_108,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&mipsKernelToUserArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a00,"0",&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a28,"to-kuseg",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a50,"Convert MIPS VMAs to kuseg",
             (allocator *)
             ((long)&inputArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_9e0,&local_a00,&local_a28,&local_a50,(CmdLineInterface *)local_108,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&inputArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b88,"input",&local_b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bb0,"Input (default stdin)",&local_bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bd8,"-",&local_bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c00,"filename",&local_c01);
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_b68,&local_b88,&local_bb0,false,&local_bd8,&local_c00,
                      (CmdLineInterface *)local_108,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  TCLAP::CmdLine::parse((CmdLine *)local_108,argc,argv);
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_388);
  __return_storage_ptr__->printHighestVaddr = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_5c8);
  __return_storage_ptr__->printLowestVaddr = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_4a8);
  __return_storage_ptr__->printEntry = bVar1;
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_750);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->printSymbolValue,(string *)pbVar2);
  piVar3 = TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_240);
  __return_storage_ptr__->roundToPage = *piVar3;
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_8c0);
  __return_storage_ptr__->mips0to1 = bVar1;
  bVar1 = TCLAP::SwitchArg::getValue((SwitchArg *)local_9e0);
  __return_storage_ptr__->mips1to0 = bVar1;
  pbVar2 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_b68);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input,(string *)pbVar2);
  cmdLine._223_1_ = 1;
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~UnlabeledValueArg
            ((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b68);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_9e0);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_8c0);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_750);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_5c8);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_4a8);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_388);
  TCLAP::ValueArg<int>::~ValueArg((ValueArg<int> *)local_240);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_108);
  if ((cmdLine._223_1_ & 1) == 0) {
    ~Args(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Args parse(int argc, char **argv){
		Args args;

		TCLAP::CmdLine cmdLine("object info printer", ' ', VERSION);
		TCLAP::ValueArg<int> roundToPageArg("r", "round-to-page", "Round output up", false, 0, "bytes", cmdLine);
		TCLAP::SwitchArg printHighestVaddrArg(">", "highest-vaddr", "Display highest vaddr", cmdLine);
		TCLAP::SwitchArg printEntryArg("E", "entrypoint", "Display entrypoint", cmdLine);
		TCLAP::SwitchArg printLowestVaddrArg("<", "lowest-vaddr", "Display lowest vaddr", cmdLine);
		TCLAP::ValueArg<std::string> printSymbolValueArg("S", "symbol-value", "Display symbol value", false, "", "sym", cmdLine);
		TCLAP::SwitchArg mipsUserToKernelArg("1", "to-kseg0", "Convert MIPS VMAs to kseg1", cmdLine);
		TCLAP::SwitchArg mipsKernelToUserArg("0", "to-kuseg", "Convert MIPS VMAs to kuseg", cmdLine);
		TCLAP::UnlabeledValueArg<std::string> inputArg("input", "Input (default stdin)", false, "-", "filename", cmdLine);

		cmdLine.parse(argc, argv);

		args.printHighestVaddr = printHighestVaddrArg.getValue();
		args.printLowestVaddr = printLowestVaddrArg.getValue();
		args.printEntry = printEntryArg.getValue();
		args.printSymbolValue = printSymbolValueArg.getValue();
		args.roundToPage = roundToPageArg.getValue();
		args.mips0to1 = mipsUserToKernelArg.getValue();
		args.mips1to0 = mipsKernelToUserArg.getValue();
		args.input = inputArg.getValue();

		return args;
	}